

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

url_mapper * __thiscall cppcms::url_mapper::parent(url_mapper *this)

{
  data *pdVar1;
  url_mapper *puVar2;
  string *error;
  hold_ptr<cppcms::url_mapper::data> *in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
  if (pdVar1->parent != (application *)0x0) {
    booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
    puVar2 = application::mapper((application *)0x3bc212);
    return puVar2;
  }
  error = (string *)__cxa_allocate_exception(0x30);
  this_00 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"url_mapper: no parent found",this_00);
  cppcms_error::cppcms_error((cppcms_error *)this_00,error);
  __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
}

Assistant:

url_mapper &url_mapper::parent()
	{
		if(d->parent) {
			return d->parent->mapper();
		}
		throw cppcms_error("url_mapper: no parent found");
	}